

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ExpNode * __thiscall Parser::ExprMultiplicative(Parser *this)

{
  uint token;
  ExpNode *pEVar1;
  
  token = this->tok;
  if (((ulong)token < 0x39) && ((0x1c03047c0004400U >> ((ulong)token & 0x3f) & 1) != 0)) {
    pEVar1 = ExprUnary(this);
    pEVar1 = ExprMultiplicativeAUX(this,pEVar1);
    return pEVar1;
  }
  Sync(this,token,exprMultiplicativeFollowSet);
  return (ExpNode *)0x0;
}

Assistant:

ExpNode *Parser::ExprMultiplicative() {
    switch (tok) {
        case NOT:
        case PLUS:
        case MINUS:
        case STAR:
        case ADDRESS:
        case ID:
        case NUMINT:
        case NUMFLOAT:
        case LITERAL:
        case LITERALCHAR:
        case TRUE:
        case FALSE:
        case LPARENT: {
            return ExprMultiplicativeAUX(ExprUnary());
        }
        default: {
            Sync(tok, exprMultiplicativeFollowSet);
        }
    }
    return nullptr;
}